

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

Id __thiscall
dxil_spv::Converter::Impl::get_physical_pointer_block_type
          (Impl *this,Id base_type_id,PhysicalPointerMeta *meta)

{
  initializer_list<unsigned_int> __l;
  anon_class_16_2_ca217506_for__M_pred __pred;
  bool bVar1;
  int iVar2;
  int iVar3;
  Id IVar4;
  Id sizeId;
  pointer pPVar5;
  Builder *pBVar6;
  Builder *pBVar7;
  char *pcVar8;
  undefined1 local_100 [8];
  PhysicalPointerEntry new_entry;
  Id ptr_type_id;
  iterator local_e0;
  undefined8 local_d8;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_d0;
  Id local_b8;
  Id local_b4;
  Id block_type_id;
  Id type_id;
  ThreadLocalAllocator<char> local_89;
  undefined1 local_88 [8];
  String type;
  Op op;
  int width;
  int vecsize;
  PhysicalPointerEntry *local_50;
  Id *local_48;
  PhysicalPointerEntry *local_40;
  __normal_iterator<dxil_spv::Converter::Impl::PhysicalPointerEntry_*,_std::vector<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>_>
  local_38;
  __normal_iterator<dxil_spv::Converter::Impl::PhysicalPointerEntry_*,_std::vector<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>_>
  local_30;
  __normal_iterator<dxil_spv::Converter::Impl::PhysicalPointerEntry_*,_std::vector<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>_>
  itr;
  PhysicalPointerMeta *meta_local;
  Impl *pIStack_18;
  Id base_type_id_local;
  Impl *this_local;
  
  itr._M_current = (PhysicalPointerEntry *)meta;
  meta_local._4_4_ = base_type_id;
  pIStack_18 = this;
  local_38._M_current =
       (PhysicalPointerEntry *)
       std::
       vector<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>
       ::begin(&this->physical_pointer_entries);
  local_40 = (PhysicalPointerEntry *)
             std::
             vector<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>
             ::end(&this->physical_pointer_entries);
  local_50 = itr._M_current;
  local_48 = (Id *)((long)&meta_local + 4);
  __pred.base_type_id = local_48;
  __pred.meta = (PhysicalPointerMeta *)itr._M_current;
  local_30 = std::
             find_if<__gnu_cxx::__normal_iterator<dxil_spv::Converter::Impl::PhysicalPointerEntry*,std::vector<dxil_spv::Converter::Impl::PhysicalPointerEntry,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>>>,dxil_spv::Converter::Impl::get_physical_pointer_block_type(unsigned_int,dxil_spv::Converter::Impl::PhysicalPointerMeta_const&)::__0>
                       (local_38,(__normal_iterator<dxil_spv::Converter::Impl::PhysicalPointerEntry_*,_std::vector<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>_>
                                  )local_40,__pred);
  _width = std::
           vector<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>
           ::end(&this->physical_pointer_entries);
  bVar1 = __gnu_cxx::operator!=
                    (&local_30,
                     (__normal_iterator<dxil_spv::Converter::Impl::PhysicalPointerEntry_*,_std::vector<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>_>
                      *)&width);
  if (bVar1) {
    pPVar5 = __gnu_cxx::
             __normal_iterator<dxil_spv::Converter::Impl::PhysicalPointerEntry_*,_std::vector<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>_>
             ::operator->(&local_30);
    this_local._4_4_ = pPVar5->ptr_type_id;
  }
  else {
    pBVar6 = builder(this);
    iVar2 = spv::Builder::getNumTypeComponents(pBVar6,meta_local._4_4_);
    pBVar6 = builder(this);
    iVar3 = spv::Builder::getScalarTypeWidth(pBVar6,meta_local._4_4_);
    pBVar6 = builder(this);
    type.field_2._12_4_ = spv::Builder::getTypeClass(pBVar6,meta_local._4_4_);
    if (type.field_2._12_4_ == OpTypeVector) {
      pBVar6 = builder(this);
      pBVar7 = builder(this);
      IVar4 = spv::Builder::getScalarTypeId(pBVar7,meta_local._4_4_);
      type.field_2._12_4_ = spv::Builder::getTypeClass(pBVar6,IVar4);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)local_88,"PhysicalPointer",&local_89);
    if (type.field_2._12_4_ == 0x15) {
      if (iVar3 == 0x10) {
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)local_88,"Ushort");
      }
      else if (iVar3 == 0x20) {
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)local_88,"Uint");
      }
      else if (iVar3 == 0x40) {
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)local_88,"Uint64");
      }
    }
    else if (type.field_2._12_4_ == 0x16) {
      if (iVar3 == 0x10) {
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)local_88,"Half");
      }
      else if (iVar3 == 0x20) {
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)local_88,"Float");
      }
      else if (iVar3 == 0x40) {
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)local_88,"Double");
      }
    }
    if (1 < iVar2) {
      std::__cxx11::to_string((__cxx11 *)&block_type_id,iVar2);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)local_88,pcVar8);
      std::__cxx11::string::~string((string *)&block_type_id);
    }
    if (((itr._M_current)->ptr_type_id & 1) != 0) {
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)local_88,"NonWrite");
    }
    if (((itr._M_current)->ptr_type_id & 0x100) != 0) {
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)local_88,"NonRead");
    }
    if (((itr._M_current)->ptr_type_id & 0x10000) != 0) {
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)local_88,"Coherent");
    }
    local_b4 = meta_local._4_4_;
    if ((char)(itr._M_current)->base_type_id != '\0') {
      iVar2._0_1_ = ((itr._M_current)->meta).nonwritable;
      iVar2._1_1_ = ((itr._M_current)->meta).nonreadable;
      iVar2._2_1_ = ((itr._M_current)->meta).coherent;
      iVar2._3_1_ = ((itr._M_current)->meta).rov;
      if (iVar2 == 0) {
        pBVar6 = builder(this);
        local_b4 = spv::Builder::makeRuntimeArray(pBVar6,local_b4);
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)local_88,"Array");
      }
      else {
        pBVar6 = builder(this);
        IVar4 = local_b4;
        pBVar7 = builder(this);
        sizeId = spv::Builder::makeUintConstant
                           (pBVar7,*(uint *)&(itr._M_current)->meta /
                                   (uint)(byte)(itr._M_current)->base_type_id,false);
        local_b4 = spv::Builder::makeArrayType
                             (pBVar6,IVar4,sizeId,(uint)(byte)(itr._M_current)->base_type_id);
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)local_88,"CBVArray");
      }
      pBVar6 = builder(this);
      spv::Builder::addDecoration
                (pBVar6,local_b4,DecorationArrayStride,(uint)(byte)(itr._M_current)->base_type_id);
    }
    pBVar6 = builder(this);
    ptr_type_id = local_b4;
    local_e0 = &ptr_type_id;
    local_d8 = 1;
    __l._M_len = 1;
    __l._M_array = local_e0;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&local_d0,__l,(allocator_type *)((long)&new_entry.meta.size + 3));
    pcVar8 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
             c_str((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)local_88);
    IVar4 = spv::Builder::makeStructType(pBVar6,&local_d0,pcVar8);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_d0);
    local_b8 = IVar4;
    pBVar6 = builder(this);
    spv::Builder::addMemberDecoration(pBVar6,local_b8,0,DecorationOffset,0);
    pBVar6 = builder(this);
    spv::Builder::addMemberName(pBVar6,local_b8,0,"value");
    pBVar6 = builder(this);
    spv::Builder::addDecoration(pBVar6,local_b8,DecorationBlock,-1);
    if (((itr._M_current)->ptr_type_id & 1) != 0) {
      pBVar6 = builder(this);
      spv::Builder::addMemberDecoration(pBVar6,local_b8,0,DecorationNonWritable,-1);
    }
    if (((itr._M_current)->ptr_type_id & 0x100) != 0) {
      pBVar6 = builder(this);
      spv::Builder::addMemberDecoration(pBVar6,local_b8,0,DecorationNonReadable,-1);
    }
    if (((itr._M_current)->ptr_type_id & 0x10000) != 0) {
      pBVar6 = builder(this);
      spv::Builder::addMemberDecoration(pBVar6,local_b8,0,DecorationCoherent,-1);
    }
    pBVar6 = builder(this);
    new_entry.meta._4_4_ =
         spv::Builder::makePointer(pBVar6,StorageClassPhysicalStorageBuffer,local_b8);
    memset(local_100,0,0x14);
    local_100._0_4_ = new_entry.meta._4_4_;
    local_100._4_4_ = meta_local._4_4_;
    new_entry.ptr_type_id = (itr._M_current)->ptr_type_id;
    new_entry.base_type_id = (itr._M_current)->base_type_id;
    new_entry.meta.nonwritable = ((itr._M_current)->meta).nonwritable;
    new_entry.meta.nonreadable = ((itr._M_current)->meta).nonreadable;
    new_entry.meta.coherent = ((itr._M_current)->meta).coherent;
    new_entry.meta.rov = ((itr._M_current)->meta).rov;
    std::
    vector<dxil_spv::Converter::Impl::PhysicalPointerEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::PhysicalPointerEntry>_>
    ::push_back(&this->physical_pointer_entries,(value_type *)local_100);
    this_local._4_4_ = new_entry.meta._4_4_;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::~basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                     *)local_88);
  }
  return this_local._4_4_;
}

Assistant:

spv::Id Converter::Impl::get_physical_pointer_block_type(spv::Id base_type_id, const PhysicalPointerMeta &meta)
{
	auto itr = std::find_if(physical_pointer_entries.begin(), physical_pointer_entries.end(), [&](const PhysicalPointerEntry &entry) {
		return entry.meta.coherent == meta.coherent &&
		       entry.meta.nonreadable == meta.nonreadable &&
		       entry.meta.nonwritable == meta.nonwritable &&
		       entry.meta.size == meta.size &&
		       entry.meta.stride == meta.stride &&
		       entry.base_type_id == base_type_id;
	});

	if (itr != physical_pointer_entries.end())
		return itr->ptr_type_id;

	int vecsize = builder().getNumTypeComponents(base_type_id);
	int width = builder().getScalarTypeWidth(base_type_id);

	spv::Op op = builder().getTypeClass(base_type_id);
	if (op == spv::OpTypeVector)
		op = builder().getTypeClass(builder().getScalarTypeId(base_type_id));

	String type = "PhysicalPointer";
	switch (op)
	{
	case spv::OpTypeFloat:
		if (width == 16)
			type += "Half";
		else if (width == 32)
			type += "Float";
		else if (width == 64)
			type += "Double";
		break;

	case spv::OpTypeInt:
		if (width == 16)
			type += "Ushort";
		else if (width == 32)
			type += "Uint";
		else if (width == 64)
			type += "Uint64";
		break;

	default:
		break;
	}

	if (vecsize > 1)
		type += std::to_string(vecsize).c_str();

	if (meta.nonwritable)
		type += "NonWrite";
	if (meta.nonreadable)
		type += "NonRead";
	if (meta.coherent)
		type += "Coherent";

	spv::Id type_id = base_type_id;

	if (meta.stride > 0)
	{
		if (meta.size == 0)
		{
			type_id = builder().makeRuntimeArray(type_id);
			type += "Array";
		}
		else
		{
			type_id = builder().makeArrayType(type_id, builder().makeUintConstant(meta.size / meta.stride),
			                                  meta.stride);
			type += "CBVArray";
		}
		builder().addDecoration(type_id, spv::DecorationArrayStride, meta.stride);
	}

	spv::Id block_type_id = builder().makeStructType({ type_id }, type.c_str());
	builder().addMemberDecoration(block_type_id, 0, spv::DecorationOffset, 0);
	builder().addMemberName(block_type_id, 0, "value");
	builder().addDecoration(block_type_id, spv::DecorationBlock);

	if (meta.nonwritable)
		builder().addMemberDecoration(block_type_id, 0, spv::DecorationNonWritable);
	if (meta.nonreadable)
		builder().addMemberDecoration(block_type_id, 0, spv::DecorationNonReadable);
	if (meta.coherent)
		builder().addMemberDecoration(block_type_id, 0, spv::DecorationCoherent);

	spv::Id ptr_type_id = builder().makePointer(spv::StorageClassPhysicalStorageBuffer, block_type_id);
	PhysicalPointerEntry new_entry = {};
	new_entry.ptr_type_id = ptr_type_id;
	new_entry.base_type_id = base_type_id;
	new_entry.meta = meta;
	physical_pointer_entries.push_back(new_entry);
	return ptr_type_id;
}